

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O2

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  long in_FS_OFFSET;
  Slice local_70;
  Slice local_60;
  Status local_50;
  char *local_48;
  size_t sStack_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.data_ = reason;
  local_60.size_ = strlen(reason);
  (*this->file_->_vptr_SequentialFile[4])(&local_48);
  local_70.data_ = local_48;
  local_70.size_ = sStack_40;
  Status::Corruption(&local_50,&local_60,&local_70);
  ReportDrop(this,bytes,&local_50);
  Status::~Status(&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason, file_->GetName()));
}